

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool BaseMap_Open(TFileStream *pStream,TCHAR *szFileName,DWORD dwStreamFlags)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  DWORD *pDVar3;
  bool bVar4;
  bool bResult;
  intptr_t handle;
  stat64 fileinfo;
  DWORD dwStreamFlags_local;
  TCHAR *szFileName_local;
  TFileStream *pStream_local;
  
  bVar4 = false;
  fileinfo.__glibc_reserved[2]._4_4_ = dwStreamFlags;
  __fd = open(szFileName,0);
  if (__fd != -1) {
    iVar1 = fstat64(__fd,(stat64 *)&handle);
    if (iVar1 != -1) {
      pvVar2 = mmap((void *)0x0,fileinfo.st_rdev,1,2,__fd,0);
      (pStream->Base).File.hFile = pvVar2;
      bVar4 = (pStream->Base).File.hFile != (HANDLE)0x0;
      if (bVar4) {
        (pStream->Base).File.FileTime = fileinfo.st_atim.tv_nsec * 10000000 + 0x19db1ded53e8000;
        (pStream->Base).File.FileSize = fileinfo.st_rdev;
        (pStream->Base).File.FilePos = 0;
      }
    }
    close(__fd);
  }
  if (!bVar4) {
    pDVar3 = (DWORD *)__errno_location();
    SetLastError(*pDVar3);
  }
  return bVar4;
}

Assistant:

static bool BaseMap_Open(TFileStream * pStream, const TCHAR * szFileName, DWORD dwStreamFlags)
{
#ifdef PLATFORM_WINDOWS

    ULARGE_INTEGER FileSize;
    HANDLE hFile;
    HANDLE hMap;
    bool bResult = false;

    // Keep compiler happy
    dwStreamFlags = dwStreamFlags;

    // Open the file for read access
    hFile = CreateFile(szFileName, FILE_READ_DATA, FILE_SHARE_READ, NULL, OPEN_EXISTING, 0, NULL);
    if(hFile != INVALID_HANDLE_VALUE)
    {
        // Retrieve file size. Don't allow mapping file of a zero size.
        FileSize.LowPart = GetFileSize(hFile, &FileSize.HighPart);
        if(FileSize.QuadPart != 0)
        {
            // Now create mapping object
            hMap = CreateFileMapping(hFile, NULL, PAGE_READONLY, 0, 0, NULL);
            if(hMap != NULL)
            {
                // Map the entire view into memory
                // Note that this operation will fail if the file can't fit
                // into usermode address space
                pStream->Base.Map.pbFile = (LPBYTE)MapViewOfFile(hMap, FILE_MAP_READ, 0, 0, 0);
                if(pStream->Base.Map.pbFile != NULL)
                {
                    // Retrieve file time
                    GetFileTime(hFile, NULL, NULL, (LPFILETIME)&pStream->Base.Map.FileTime);

                    // Retrieve file size and position
                    pStream->Base.Map.FileSize = FileSize.QuadPart;
                    pStream->Base.Map.FilePos = 0;
                    bResult = true;
                }

                // Close the map handle
                CloseHandle(hMap);
            }
        }

        // Close the file handle
        CloseHandle(hFile);
    }

    // If the file is not there and is not available for random access,
    // report error
    if(bResult == false)
        return false;
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    struct stat64 fileinfo;
    intptr_t handle;
    bool bResult = false;

    // Open the file
    handle = open(szFileName, O_RDONLY);
    if(handle != -1)
    {
        // Get the file size
        if(fstat64(handle, &fileinfo) != -1)
        {
            pStream->Base.Map.pbFile = (LPBYTE)mmap(NULL, (size_t)fileinfo.st_size, PROT_READ, MAP_PRIVATE, handle, 0);
            if(pStream->Base.Map.pbFile != NULL)
            {
                // time_t is number of seconds since 1.1.1970, UTC.
                // 1 second = 10000000 (decimal) in FILETIME
                // Set the start to 1.1.1970 00:00:00
                pStream->Base.Map.FileTime = 0x019DB1DED53E8000ULL + (10000000 * fileinfo.st_mtime);
                pStream->Base.Map.FileSize = (ULONGLONG)fileinfo.st_size;
                pStream->Base.Map.FilePos = 0;
                bResult = true;
            }
        }
        close(handle);
    }

    // Did the mapping fail?
    if(bResult == false)
    {
        SetLastError(errno);
        return false;
    }
#endif

    return true;
}